

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O2

bool __thiscall ValueSerializer::operator()(ValueSerializer *this,FILE *fp,string *value)

{
  bool bVar1;
  int iVar2;
  void *__ptr;
  size_t sVar3;
  int size;
  
  bVar1 = operator()(this,fp,&size);
  if (bVar1) {
    sVar3 = (size_t)size;
    iVar2 = -1;
    if (-1 < size) {
      iVar2 = size;
    }
    __ptr = operator_new__((long)iVar2);
    sVar3 = fread(__ptr,sVar3,1,(FILE *)fp);
    bVar1 = sVar3 == 1;
    if (bVar1) {
      (value->_M_dataplus)._M_p = (pointer)&value->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)value,__ptr,(long)__ptr + (long)size);
    }
    operator_delete__(__ptr);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator()(FILE* fp, string* value) {
    int size;
    if (!(*this)(fp, &size)) return false;
    char* buf = new char[size];
    if (fread(buf, size, 1, fp) != 1) {
      delete[] buf;
      return false;
    }
    new (value) string(buf, size);
    delete[] buf;
    return true;
  }